

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qprogressdialog.cpp
# Opt level: O0

void QProgressDialog::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QProgressDialog *_t;
  QString *in_stack_ffffffffffffff88;
  int minimum;
  QProgressDialog *in_stack_ffffffffffffff90;
  QProgressDialog *in_stack_ffffffffffffff98;
  QProgressDialogPrivate *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  int *piVar4;
  int progress;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  progress = (int)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    in_stack_ffffffffffffff98 = (QProgressDialog *)(ulong)in_EDX;
    minimum = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
    switch(in_stack_ffffffffffffff98) {
    case (QProgressDialog *)0x0:
      canceled((QProgressDialog *)0x7b26e0);
      break;
    case (QProgressDialog *)0x1:
      cancel(in_stack_ffffffffffffff90);
      break;
    case (QProgressDialog *)0x2:
      reset(in_stack_ffffffffffffff90);
      break;
    case (QProgressDialog *)0x3:
      setMaximum(in_stack_ffffffffffffff90,minimum);
      break;
    case (QProgressDialog *)0x4:
      setMinimum(in_stack_ffffffffffffff90,minimum);
      break;
    case (QProgressDialog *)0x5:
      setRange(in_stack_ffffffffffffff90,minimum,(int)in_stack_ffffffffffffff88);
      break;
    case (QProgressDialog *)0x6:
      setValue((QProgressDialog *)in_RCX,progress);
      break;
    case (QProgressDialog *)0x7:
      setLabelText(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      break;
    case (QProgressDialog *)0x8:
      setCancelButtonText(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      break;
    case (QProgressDialog *)0x9:
      setMinimumDuration(in_stack_ffffffffffffff90,iVar3);
      break;
    case (QProgressDialog *)0xa:
      forceShow(in_stack_ffffffffffffff90);
      break;
    case (QProgressDialog *)0xb:
      d_func((QProgressDialog *)0x7b27c7);
      QProgressDialogPrivate::_q_disconnectOnClose(in_stack_ffffffffffffffa0);
    }
  }
  if ((in_ESI != 5) ||
     (bVar2 = QtMocHelpers::indexOfMethod<void(QProgressDialog::*)()>(in_RCX,(void **)canceled,0,0),
     !bVar2)) {
    if (in_ESI == 1) {
      piVar4 = *(int **)in_RCX;
      in_stack_ffffffffffffff90 = (QProgressDialog *)(ulong)in_EDX;
      switch(in_stack_ffffffffffffff90) {
      case (QProgressDialog *)0x0:
        bVar2 = wasCanceled(in_stack_ffffffffffffff90);
        *(bool *)piVar4 = bVar2;
        break;
      case (QProgressDialog *)0x1:
        iVar3 = QProgressDialog::minimum(in_stack_ffffffffffffff90);
        *piVar4 = iVar3;
        break;
      case (QProgressDialog *)0x2:
        iVar3 = maximum(in_stack_ffffffffffffff90);
        *piVar4 = iVar3;
        break;
      case (QProgressDialog *)0x3:
        iVar3 = value(in_stack_ffffffffffffff90);
        *piVar4 = iVar3;
        break;
      case (QProgressDialog *)0x4:
        bVar2 = autoReset(in_stack_ffffffffffffff90);
        *(bool *)piVar4 = bVar2;
        break;
      case (QProgressDialog *)0x5:
        bVar2 = autoClose(in_stack_ffffffffffffff90);
        *(bool *)piVar4 = bVar2;
        break;
      case (QProgressDialog *)0x6:
        iVar3 = minimumDuration(in_stack_ffffffffffffff90);
        *piVar4 = iVar3;
        break;
      case (QProgressDialog *)0x7:
        labelText(in_stack_ffffffffffffff98);
        QString::operator=((QString *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        QString::~QString((QString *)0x7b2922);
      }
      iVar3 = (int)((ulong)piVar4 >> 0x20);
    }
    if (in_ESI == 2) {
      switch((QString *)(ulong)(in_EDX - 1)) {
      case (QString *)0x0:
        setMinimum(in_stack_ffffffffffffff90,0);
        break;
      case (QString *)0x1:
        setMaximum(in_stack_ffffffffffffff90,0);
        break;
      case (QString *)0x2:
        setValue((QProgressDialog *)in_RCX,progress);
        break;
      case (QString *)0x3:
        setAutoReset(in_stack_ffffffffffffff90,false);
        break;
      case (QString *)0x4:
        setAutoClose(in_stack_ffffffffffffff90,false);
        break;
      case (QString *)0x5:
        setMinimumDuration(in_stack_ffffffffffffff90,iVar3);
        break;
      case (QString *)0x6:
        setLabelText(in_stack_ffffffffffffff90,(QString *)(ulong)(in_EDX - 1));
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QProgressDialog::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QProgressDialog *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->canceled(); break;
        case 1: _t->cancel(); break;
        case 2: _t->reset(); break;
        case 3: _t->setMaximum((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->setMinimum((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: _t->setRange((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 6: _t->setValue((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 7: _t->setLabelText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 8: _t->setCancelButtonText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 9: _t->setMinimumDuration((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 10: _t->forceShow(); break;
        case 11: _t->d_func()->_q_disconnectOnClose(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QProgressDialog::*)()>(_a, &QProgressDialog::canceled, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->wasCanceled(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->minimum(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->maximum(); break;
        case 3: *reinterpret_cast<int*>(_v) = _t->value(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->autoReset(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->autoClose(); break;
        case 6: *reinterpret_cast<int*>(_v) = _t->minimumDuration(); break;
        case 7: *reinterpret_cast<QString*>(_v) = _t->labelText(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 1: _t->setMinimum(*reinterpret_cast<int*>(_v)); break;
        case 2: _t->setMaximum(*reinterpret_cast<int*>(_v)); break;
        case 3: _t->setValue(*reinterpret_cast<int*>(_v)); break;
        case 4: _t->setAutoReset(*reinterpret_cast<bool*>(_v)); break;
        case 5: _t->setAutoClose(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setMinimumDuration(*reinterpret_cast<int*>(_v)); break;
        case 7: _t->setLabelText(*reinterpret_cast<QString*>(_v)); break;
        default: break;
        }
    }
}